

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O2

void __thiscall cmCPackIFWInstaller::GeneratePackageFiles(cmCPackIFWInstaller *this)

{
  bool bVar1;
  char *pcVar2;
  _Base_ptr p_Var3;
  string forcedOption;
  cmCPackIFWPackage package;
  allocator local_359;
  string local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  string local_2f8;
  cmCPackIFWPackage local_2d8;
  
  if (((this->Packages)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (bVar1 = cmCPackIFWGenerator::IsOnePackage((this->super_cmCPackIFWCommon).Generator), !bVar1))
  {
    for (p_Var3 = (this->Packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->Packages)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      cmCPackIFWPackage::GeneratePackageFile(*(cmCPackIFWPackage **)(p_Var3 + 2));
    }
    return;
  }
  cmCPackIFWPackage::cmCPackIFWPackage(&local_2d8);
  local_2d8.super_cmCPackIFWCommon.Generator = (this->super_cmCPackIFWCommon).Generator;
  local_2d8.Installer = this;
  std::__cxx11::string::string
            ((string *)&local_358,"CPACK_IFW_PACKAGE_GROUP",(allocator *)&local_338);
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  if (pcVar2 == (char *)0x0) {
    cmCPackIFWPackage::ConfigureFromOptions(&local_2d8);
  }
  else {
    std::__cxx11::string::string((string *)&local_358,pcVar2,(allocator *)&local_338);
    cmCPackIFWPackage::ConfigureFromGroup(&local_2d8,&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::string((string *)&local_318,pcVar2,&local_359);
    cmsys::SystemTools::UpperCase(&local_2f8,&local_318);
    std::operator+(&local_338,"CPACK_IFW_COMPONENT_GROUP_",&local_2f8);
    std::operator+(&local_358,&local_338,"_FORCED_INSTALLATION");
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_318);
    pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_358);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::assign((char *)&local_2d8.ForcedInstallation);
    }
    std::__cxx11::string::~string((string *)&local_358);
  }
  cmCPackIFWPackage::GeneratePackageFile(&local_2d8);
  cmCPackIFWPackage::~cmCPackIFWPackage(&local_2d8);
  return;
}

Assistant:

void cmCPackIFWInstaller::GeneratePackageFiles()
{
  if (this->Packages.empty() || this->Generator->IsOnePackage()) {
    // Generate default package
    cmCPackIFWPackage package;
    package.Generator = this->Generator;
    package.Installer = this;
    // Check package group
    if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_GROUP")) {
      package.ConfigureFromGroup(option);
      std::string forcedOption = "CPACK_IFW_COMPONENT_GROUP_" +
        cmsys::SystemTools::UpperCase(option) + "_FORCED_INSTALLATION";
      if (!GetOption(forcedOption)) {
        package.ForcedInstallation = "true";
      }
    } else {
      package.ConfigureFromOptions();
    }
    package.GeneratePackageFile();
    return;
  }

  // Generate packages meta information
  for (PackagesMap::iterator pit = this->Packages.begin();
       pit != this->Packages.end(); ++pit) {
    cmCPackIFWPackage* package = pit->second;
    package->GeneratePackageFile();
  }
}